

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionsPdu.cpp
# Opt level: O0

bool __thiscall
DIS::ElectromagneticEmissionsPdu::operator==
          (ElectromagneticEmissionsPdu *this,ElectromagneticEmissionsPdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  ulong local_28;
  size_t idx;
  bool ivarsEqual;
  ElectromagneticEmissionsPdu *rhs_local;
  ElectromagneticEmissionsPdu *this_local;
  
  idx._7_1_ = DistributedEmissionsFamilyPdu::operator==
                        (&this->super_DistributedEmissionsFamilyPdu,
                         &rhs->super_DistributedEmissionsFamilyPdu);
  bVar1 = EntityID::operator==(&this->_emittingEntityID,&rhs->_emittingEntityID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  bVar1 = EventID::operator==(&this->_eventID,&rhs->_eventID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_stateUpdateIndicator != rhs->_stateUpdateIndicator) {
    idx._7_1_ = false;
  }
  if (this->_paddingForEmissionsPdu != rhs->_paddingForEmissionsPdu) {
    idx._7_1_ = false;
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::
            vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
            ::size(&this->_systems);
    if (sVar2 <= local_28) break;
    this_00 = std::
              vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
              ::operator[](&this->_systems,local_28);
    rhs_00 = std::
             vector<DIS::ElectromagneticEmissionSystemData,_std::allocator<DIS::ElectromagneticEmissionSystemData>_>
             ::operator[](&rhs->_systems,local_28);
    bVar1 = ElectromagneticEmissionSystemData::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_28 = local_28 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool ElectromagneticEmissionsPdu::operator ==(const ElectromagneticEmissionsPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = DistributedEmissionsFamilyPdu::operator==(rhs);

     if( ! (_emittingEntityID == rhs._emittingEntityID) ) ivarsEqual = false;
     if( ! (_eventID == rhs._eventID) ) ivarsEqual = false;
     if( ! (_stateUpdateIndicator == rhs._stateUpdateIndicator) ) ivarsEqual = false;
     if( ! (_paddingForEmissionsPdu == rhs._paddingForEmissionsPdu) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _systems.size(); idx++)
     {
        if( ! ( _systems[idx] == rhs._systems[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }